

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_driver.cc
# Opt level: O1

void test_63(QPDF *pdf,char *arg2)

{
  QPDFWriter w;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_10;
  
  QPDFWriter::QPDFWriter(&w,pdf);
  QPDFWriter::setR6EncryptionParameters
            ((char *)&w,"u",true,true,true,true,true,true,qpdf_r3p_low,false);
  QPDFWriter::setOutputFilename((char *)&w);
  QPDFWriter::write();
  if (local_10 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_10);
  }
  return;
}

Assistant:

static void
test_63(QPDF& pdf, char const* arg2)
{
    QPDFWriter w(pdf);
    // Exercise setting encryption parameters before setting the
    // output filename. The previous bug does not happen if static
    // or deterministic ID is used because the filename is not
    // used as part of the input data for ID generation in those
    // cases.
    w.setR6EncryptionParameters("u", "o", true, true, true, true, true, true, qpdf_r3p_full, true);
    w.setOutputFilename("a.pdf");
    w.write();
}